

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.hpp
# Opt level: O1

void Diligent::HandleHLSLCompilerResult<IDxcBlob>
               (bool CompilationSucceeded,IDxcBlob *pCompilerMsgBlob,string *ShaderSource,
               char *ShaderName,IDataBlob **ppOutputLog)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  void *pvVar3;
  size_t sVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  char *pcVar6;
  undefined7 in_register_00000039;
  byte bVar7;
  ulong uVar8;
  string _msg;
  RefCntAutoPtr<Diligent::DataBlobImpl> pOutputLogBlob;
  string local_210;
  uint local_1ec;
  void *local_1e8;
  char *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  IMemoryAllocator *local_1a8;
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  uVar8 = CONCAT71(in_register_00000039,CompilationSucceeded) & 0xffffffff;
  local_1e0 = ShaderName;
  if (pCompilerMsgBlob == (IDxcBlob *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    iVar2 = (*(pCompilerMsgBlob->super_IUnknown)._vptr_IUnknown[3])(pCompilerMsgBlob);
    pvVar3 = (void *)CONCAT44(extraout_var,iVar2);
  }
  if (pvVar3 == (void *)0x0) {
    __n = 0;
  }
  else {
    iVar2 = (*(pCompilerMsgBlob->super_IUnknown)._vptr_IUnknown[4])(pCompilerMsgBlob);
    __n = CONCAT44(extraout_var_00,iVar2);
  }
  if (ppOutputLog != (IDataBlob **)0x0) {
    sVar4 = ShaderSource->_M_string_length;
    local_1e8 = pvVar3;
    DataBlobImpl::Create((DataBlobImpl *)local_1b8,__n + sVar4 + 2,(void *)0x0);
    pvVar3 = DataBlobImpl::GetDataPtr((DataBlobImpl *)local_1b8._0_8_,0);
    local_1ec = (uint)CONCAT71(in_register_00000039,CompilationSucceeded);
    if (local_1e8 != (void *)0x0) {
      memcpy(pvVar3,local_1e8,__n);
    }
    *(undefined1 *)((long)pvVar3 + __n) = 0;
    memcpy((void *)((long)pvVar3 + __n + 1),(ShaderSource->_M_dataplus)._M_p,sVar4);
    *(undefined1 *)((long)pvVar3 + sVar4 + 1 + __n) = 0;
    DataBlobImpl::QueryInterface
              ((DataBlobImpl *)local_1b8._0_8_,(INTERFACE_ID *)IID_DataBlob,(IObject **)ppOutputLog)
    ;
    uVar8 = (ulong)local_1ec;
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_1b8);
    pvVar3 = local_1e8;
  }
  bVar7 = (byte)uVar8;
  if ((__n == 0 & bVar7) != 0) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  pcVar6 = "Failed to compile shader \'";
  if (bVar7 != 0) {
    pcVar6 = "Compiler output for shader \'";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar6,(uVar8 & 0xff) * 2 + 0x1a);
  pcVar6 = "<unknown>";
  if (local_1e0 != (char *)0x0) {
    pcVar6 = local_1e0;
  }
  sVar4 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\'",1);
  if ((pvVar3 == (void *)0x0) || (__n == 0)) {
    if (bVar7 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," (no shader log available).",0x1b);
      goto LAB_002a51aa;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    cVar1 = (char)(ostream *)&local_1a8;
    std::ios::widen((char)local_1a8[-3]._vptr_IMemoryAllocator + cVar1);
    std::ostream::put(cVar1);
    poVar5 = (ostream *)std::ostream::flush();
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,pvVar3,__n + (long)pvVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_210._M_dataplus._M_p,local_210._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
LAB_002a51aa:
    if (bVar7 == 0) {
      std::__cxx11::stringbuf::str();
      LogError<true,std::__cxx11::string>
                (false,"HandleHLSLCompilerResult",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/HLSLUtils.hpp"
                 ,0x60,&local_210);
      goto LAB_002a5237;
    }
  }
  std::__cxx11::stringbuf::str();
  FormatString<std::__cxx11::string>(&local_210,(Diligent *)local_1d8,Args);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_210._M_dataplus._M_p,0,0,0);
  }
LAB_002a5237:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void HandleHLSLCompilerResult(bool               CompilationSucceeded,
                              BlobType*          pCompilerMsgBlob,
                              const std::string& ShaderSource,
                              const char*        ShaderName,
                              IDataBlob**        ppOutputLog) noexcept(false)
{
    const char*  CompilerMsg    = pCompilerMsgBlob ? static_cast<const char*>(pCompilerMsgBlob->GetBufferPointer()) : nullptr;
    const size_t CompilerMsgLen = CompilerMsg ? pCompilerMsgBlob->GetBufferSize() : 0;

    if (ppOutputLog != nullptr)
    {
        const size_t                ShaderSourceLen = ShaderSource.length();
        RefCntAutoPtr<DataBlobImpl> pOutputLogBlob  = DataBlobImpl::Create(ShaderSourceLen + 1 + CompilerMsgLen + 1);

        char* log = pOutputLogBlob->GetDataPtr<char>();

        if (CompilerMsg != nullptr)
            memcpy(log, CompilerMsg, CompilerMsgLen);
        log[CompilerMsgLen] = 0; // Explicitly set null terminator
        log += CompilerMsgLen + 1;

        memcpy(log, ShaderSource.data(), ShaderSourceLen);
        log[ShaderSourceLen] = 0;

        pOutputLogBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppOutputLog));
    }

    if (!CompilationSucceeded || CompilerMsgLen != 0)
    {
        std::stringstream ss;
        ss << (CompilationSucceeded ? "Compiler output for shader '" : "Failed to compile shader '")
           << (ShaderName != nullptr ? ShaderName : "<unknown>")
           << "'";
        if (CompilerMsg != nullptr && CompilerMsgLen != 0)
        {
            ss << ":" << std::endl
               << std::string{CompilerMsg, CompilerMsgLen};
        }
        else if (!CompilationSucceeded)
        {
            ss << " (no shader log available).";
        }

        if (CompilationSucceeded)
        {
            LOG_INFO_MESSAGE(ss.str());
        }
        else
        {
            LOG_ERROR_AND_THROW(ss.str());
        }
    }
}